

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

double google::protobuf::io::NoLocaleStrtod(char *str,char **endptr)

{
  char *last;
  double dVar1;
  from_chars_result fVar2;
  from_chars_result result;
  char *end;
  double ret;
  char **endptr_local;
  char *str_local;
  
  end = (char *)0x0;
  ret = (double)endptr;
  endptr_local = (char **)str;
  last = strchr(str,0);
  fVar2 = absl::lts_20250127::from_chars
                    ((Nonnull<const_char_*>)endptr_local,last,(double *)&end,general);
  if (fVar2.ec == result_out_of_range) {
    if ((double)end <= 1.0) {
      if ((double)end < -1.0) {
        dVar1 = std::numeric_limits<double>::infinity();
        end = (char *)((ulong)dVar1 ^ 0x8000000000000000);
      }
    }
    else {
      end = (char *)std::numeric_limits<double>::infinity();
    }
  }
  if (ret != 0.0) {
    *(Nonnull<const_char_*> *)ret = fVar2.ptr;
  }
  return (double)end;
}

Assistant:

double NoLocaleStrtod(const char *str, char **endptr) {
  double ret = 0.0;
  // This isn't ideal, but the existing function interface does not provide any
  // bounds.
  const char *end = strchr(str, 0);
  auto result = absl::from_chars(str, end, ret);
  // from_chars() with DR 3081's current wording will return max() on
  // overflow.  SimpleAtod returns infinity instead.
  if (result.ec == std::errc::result_out_of_range) {
    if (ret > 1.0) {
      ret = std::numeric_limits<double>::infinity();
    } else if (ret < -1.0) {
      ret = -std::numeric_limits<double>::infinity();
    }
  }
  if (endptr) {
    *endptr = const_cast<char *>(result.ptr);
  }
  return ret;
}